

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O1

HCOSE_SIGNER COSE_Sign_add_signer(HCOSE_SIGN hSign,cn_cbor *pkey,int algId,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback in_RAX;
  HCOSE_SIGNER h;
  cn_cbor *pcVar3;
  HCOSE_SIGNER p_Var4;
  cn_cbor_errback cbor_error;
  cn_cbor_errback local_38;
  
  if ((hSign == (HCOSE_SIGN)0x0) ||
     (local_38 = in_RAX, _Var1 = _COSE_IsInList(SignRoot,(COSE *)hSign), !_Var1)) {
    cVar2 = COSE_ERR_INVALID_HANDLE;
LAB_00206347:
    p_Var4 = (HCOSE_SIGNER)0x0;
    h = (HCOSE_SIGNER)0x0;
    pcVar3 = (cn_cbor *)0x0;
    if (perr == (cose_errback *)0x0) goto LAB_0020635a;
LAB_00206354:
    perr->err = cVar2;
    h = p_Var4;
  }
  else {
    if (pkey == (cn_cbor *)0x0) {
      cVar2 = COSE_ERR_INVALID_PARAMETER;
      goto LAB_00206347;
    }
    h = COSE_Signer_Init(perr);
    if (h == (HCOSE_SIGNER)0x0) {
      pcVar3 = (cn_cbor *)0x0;
      h = (HCOSE_SIGNER)0x0;
      goto LAB_0020635a;
    }
    pcVar3 = cn_cbor_int_create((long)algId,&local_38);
    p_Var4 = h;
    if (pcVar3 == (cn_cbor *)0x0) {
LAB_00206396:
      if (perr == (cose_errback *)0x0) goto LAB_00206357;
      cVar2 = _MapFromCBOR(local_38);
      goto LAB_00206354;
    }
    _Var1 = COSE_Signer_map_put_int(h,1,pcVar3,1,perr);
    if (!_Var1) goto LAB_0020635a;
    pcVar3 = cn_cbor_mapget_int(pkey,2);
    if (pcVar3 != (cn_cbor *)0x0) {
      if (pcVar3->type != CN_CBOR_BYTES) {
        cVar2 = COSE_ERR_INVALID_PARAMETER;
        if (perr != (cose_errback *)0x0) goto LAB_00206354;
        goto LAB_00206357;
      }
      pcVar3 = cn_cbor_data_create((pcVar3->v).bytes,pcVar3->length,&local_38);
      if (pcVar3 == (cn_cbor *)0x0) goto LAB_00206396;
      _Var1 = COSE_Signer_map_put_int(h,4,pcVar3,2,perr);
      if (!_Var1) goto LAB_0020635a;
    }
    _Var1 = COSE_Signer_SetKey(h,pkey,perr);
    if ((_Var1) && (_Var1 = COSE_Sign_AddSigner(hSign,h,perr), _Var1)) {
      return h;
    }
  }
LAB_00206357:
  pcVar3 = (cn_cbor *)0x0;
LAB_0020635a:
  if (pcVar3 != (cn_cbor *)0x0) {
    cn_cbor_free(pcVar3);
  }
  if (h != (HCOSE_SIGNER)0x0) {
    COSE_Signer_Free(h);
  }
  return (HCOSE_SIGNER)0x0;
}

Assistant:

HCOSE_SIGNER COSE_Sign_add_signer(HCOSE_SIGN hSign, const cn_cbor * pkey, int algId, cose_errback * perr)
{
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
	COSE_SignMessage * pMessage = (COSE_SignMessage *)hSign;
#endif
	const cn_cbor * cbor;
	cn_cbor * cbor2 = NULL;
	HCOSE_SIGNER hSigner = NULL;
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidSignHandle(hSign), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pkey != NULL, COSE_ERR_INVALID_PARAMETER);

#ifdef USE_CBOR_CONTEXT
	context = &pMessage->m_message.m_allocContext;
#endif

	hSigner = COSE_Signer_Init(CBOR_CONTEXT_PARAM_COMMA perr);
	if (hSigner == NULL) goto errorReturn;


	cbor2 = cn_cbor_int_create(algId, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cbor2 != NULL, cbor_error);
	if (!COSE_Signer_map_put_int(hSigner, COSE_Header_Algorithm, cbor2, COSE_PROTECT_ONLY, perr)) goto errorReturn;
	cbor2 = NULL;

	cbor = cn_cbor_mapget_int(pkey, COSE_Key_ID);
	if (cbor != NULL) {
		CHECK_CONDITION(cbor->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		cbor2 = cn_cbor_data_create(cbor->v.bytes, (int) cbor->length, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cbor2 != NULL, cbor_error);
		if (!COSE_Signer_map_put_int(hSigner, COSE_Header_KID, cbor2, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cbor2 = NULL;
	}

	if (!COSE_Signer_SetKey(hSigner, pkey, perr)) goto errorReturn;

	if (!COSE_Sign_AddSigner(hSign, hSigner, perr)) goto errorReturn;

	return hSigner;

errorReturn:
	if (cbor2 != NULL) CN_CBOR_FREE((void *)cbor2, context);
	if (hSigner != NULL) COSE_Signer_Free(hSigner);
	return NULL;
}